

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O0

void __thiscall gl4cts::TextureBarrierBasicOutline::render(TextureBarrierBasicOutline *this)

{
  int iVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  int local_20;
  int count;
  int first;
  int minTriCountPerDraw;
  Functions *gl;
  TextureBarrierBasicOutline *this_local;
  
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_TextureBarrierBaseTest).super_TestCase.m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  for (local_20 = 0; local_20 < 0x6000; local_20 = iVar2 + local_20) {
    iVar2 = ::deMin32(0x6000 - local_20,(local_20 % 0x17 + 0x492) * 3);
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x538))(4,local_20,iVar2);
  }
  return;
}

Assistant:

void render()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		// Issue the whole grid using multiple separate draw commands
		int minTriCountPerDraw = TRIANGLE_COUNT / 7;
		int first = 0, count = 0;
		while (first < VERTEX_COUNT)
		{
			// Pseudo-random number of vertices per draw
			count = deMin32(VERTEX_COUNT - first, (first % 23 + minTriCountPerDraw) * 3);

			gl.drawArrays(GL_TRIANGLES, first, count);

			first += count;
		}
	}